

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateResourceMapping
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,
          ResourceMappingCreateInfo *ResMappingCI,IResourceMapping **ppMapping)

{
  ResourceMappingEntry *pRVar1;
  long lVar2;
  IMemoryAllocator *CtorArgs;
  ResourceMappingImpl *pRVar3;
  Uint32 i;
  ulong uVar4;
  long lVar5;
  string msg;
  
  if (ppMapping == (IResourceMapping **)0x0) {
    FormatString<char[22]>(&msg,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateResourceMapping",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xeb);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    if (*ppMapping != (IResourceMapping *)0x0) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xee);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) && (ResMappingCI->NumEntries == 0))
    {
      FormatString<char[89]>
                (&msg,(char (*) [89])
                      "Starting with API253010, the number of entries is defined through the NumEntries member."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xef);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = (pointer)&this->m_ResMappingAllocator;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_528cb;
    msg.field_2._8_8_ = anon_var_dwarf_27750c;
    CtorArgs = GetRawAllocator();
    pRVar3 = MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>
                         *)&msg,CtorArgs);
    (**(pRVar3->super_ObjectBase<Diligent::IResourceMapping>).
       super_RefCountedObject<Diligent::IResourceMapping>.super_IResourceMapping.super_IObject.
       _vptr_IObject)(pRVar3,IID_ResourceMapping,ppMapping);
    if (ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) {
      lVar5 = 8;
      for (uVar4 = 0; uVar4 < ResMappingCI->NumEntries; uVar4 = uVar4 + 1) {
        pRVar1 = ResMappingCI->pEntries;
        lVar2 = *(long *)((long)pRVar1 + lVar5 + -8);
        if ((lVar2 == 0) || (*(long *)((long)&pRVar1->Name + lVar5) == 0)) {
          FormatString<char[134]>
                    (&msg,(char (*) [134])
                          "Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member."
                    );
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"CreateResourceMapping",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                     ,0xfb);
          std::__cxx11::string::~string((string *)&msg);
        }
        else {
          (*((*ppMapping)->super_IObject)._vptr_IObject[5])
                    (*ppMapping,lVar2,(ulong)*(uint *)((long)&pRVar1->pObject + lVar5),
                     (long)&pRVar1->Name + lVar5,1,1);
        }
        lVar5 = lVar5 + 0x18;
      }
    }
  }
  return;
}

Assistant:

CreateResourceMapping(const ResourceMappingCreateInfo& ResMappingCI, IResourceMapping** ppMapping) override final
    {
        DEV_CHECK_ERR(ppMapping != nullptr, "Null pointer provided");
        if (ppMapping == nullptr)
            return;
        DEV_CHECK_ERR(*ppMapping == nullptr, "Overwriting reference to existing object may cause memory leaks");
        DEV_CHECK_ERR(ResMappingCI.pEntries == nullptr || ResMappingCI.NumEntries != 0, "Starting with API253010, the number of entries is defined through the NumEntries member.");

        ResourceMappingImpl* pResourceMapping{NEW_RC_OBJ(m_ResMappingAllocator, "ResourceMappingImpl instance", ResourceMappingImpl)(GetRawAllocator())};
        pResourceMapping->QueryInterface(IID_ResourceMapping, reinterpret_cast<IObject**>(ppMapping));
        if (ResMappingCI.pEntries != nullptr)
        {
            for (Uint32 i = 0; i < ResMappingCI.NumEntries; ++i)
            {
                const ResourceMappingEntry& Entry = ResMappingCI.pEntries[i];
                if (Entry.Name != nullptr && Entry.pObject != nullptr)
                    (*ppMapping)->AddResourceArray(Entry.Name, Entry.ArrayIndex, &Entry.pObject, 1, true);
                else
                    DEV_ERROR("Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member.");
            }
        }
    }